

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_>
::createInstance(InstanceFactory1<vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_>
                 *this,Context *context)

{
  TestInstance *pTVar1;
  
  pTVar1 = (TestInstance *)operator_new(0x40);
  pTVar1->m_context = context;
  pTVar1->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00cf43e0;
  pTVar1[1]._vptr_TestInstance = (_func_int **)(this->m_arg0).func;
  *(int *)&pTVar1[1].m_context = (this->m_arg0).arg0.renderSize.m_data[0];
  *(VkFormat *)((long)&pTVar1[2]._vptr_TestInstance + 4) = (this->m_arg0).arg0.colorFormat;
  *(undefined8 *)((long)&pTVar1[1].m_context + 4) =
       *(undefined8 *)((this->m_arg0).arg0.renderSize.m_data + 1);
  pTVar1[2].m_context = *(Context **)&(this->m_arg0).arg0.numSamples;
  *(undefined4 *)&pTVar1[3]._vptr_TestInstance =
       *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
  *(undefined4 *)((long)&pTVar1[3]._vptr_TestInstance + 4) =
       *(undefined4 *)
        ((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4);
  *(undefined1 *)&pTVar1[3].m_context =
       *(undefined1 *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  return pTVar1;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }